

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_idict_get_flag(stb_idict *a,stb_int32 k,stb_int32 *v)

{
  stb__stb_idict__hashpair *psVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar6;
  stb_int32 *psVar7;
  ulong uVar5;
  
  uVar3 = stb_hashptr((void *)(ulong)(uint)k);
  if (k == 3) {
    bVar2 = a->has_del;
    if (bVar2 == 0) {
      return 0;
    }
    psVar7 = &a->dv;
  }
  else if (k == 1) {
    bVar2 = a->has_empty;
    if (bVar2 == 0) {
      return 0;
    }
    psVar7 = &a->ev;
  }
  else {
    uVar4 = a->mask & uVar3;
    uVar5 = (ulong)uVar4;
    psVar1 = a->table;
    uVar6 = (ulong)uVar4;
    if (psVar1[uVar6].k == 1) {
      return 0;
    }
    if (psVar1[uVar6].k != k) {
      do {
        uVar5 = (ulong)((int)uVar5 + ((uVar3 >> 0x13) + (uVar3 >> 6) + uVar3 | 1) & a->mask);
        if (psVar1[uVar5].k == 1) {
          return 0;
        }
        uVar6 = uVar5;
      } while (psVar1[uVar5].k != k);
    }
    psVar7 = &psVar1[uVar6].v;
    bVar2 = 1;
  }
  *v = *psVar7;
  return (uint)bVar2;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}